

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O3

void printf_btr_bxcan(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%10s","CAN_BTR");
    return;
  }
  printf("0x%08x",(ulong)(bt->sjw * 0x1000000 + 0x3000000 & 0x3000000 |
                         bt->phase_seg2 * 0x100000 + 0x700000 & 0x700000 |
                         (bt->phase_seg1 + bt->prop_seg) * 0x10000 + 0xf0000 & 0xf0000 |
                         bt->brp - 1 & 0x3ff));
  return;
}

Assistant:

static void printf_btr_bxcan(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CAN_BTR");
	} else {
		uint32_t btr;

		btr = (((bt->brp -1) & 0x3ff) << 0) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xf) << 16) |
			(((bt->phase_seg2 -1) & 0x7) << 20) |
			(((bt->sjw -1) & 0x3) << 24);

		printf("0x%08x", btr);
	}
}